

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O1

bool __thiscall flatbuffers::csharp::CSharpGenerator::generate(CSharpGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EnumDef *enum_def;
  StructDef *struct_def;
  bool bVar2;
  Parser *pPVar3;
  pointer ppEVar4;
  pointer ppSVar5;
  string enumcode;
  string one_file_code;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pPVar3 = (this->super_BaseGenerator).parser_;
  this->cur_name_space_ = pPVar3->current_namespace_;
  ppEVar4 = (pPVar3->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar4 !=
      (pPVar3->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_70.field_2;
    do {
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      enum_def = *ppEVar4;
      if ((pPVar3->opts).one_file == false) {
        this->cur_name_space_ = (enum_def->super_Definition).defined_namespace;
      }
      local_70._M_dataplus._M_p = (pointer)paVar1;
      GenEnum(this,enum_def,&local_70,&pPVar3->opts);
      pPVar3 = (this->super_BaseGenerator).parser_;
      if ((pPVar3->opts).one_file == true) {
        std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
      }
      else {
        bVar2 = SaveType(this,(string *)enum_def,(enum_def->super_Definition).defined_namespace,
                         &local_70,false,&pPVar3->opts);
        if (!bVar2) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == paVar1) goto LAB_001a54fb;
          goto LAB_001a54ee;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      ppEVar4 = ppEVar4 + 1;
      pPVar3 = (this->super_BaseGenerator).parser_;
    } while (ppEVar4 !=
             (pPVar3->enums_).vec.
             super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  pPVar3 = (this->super_BaseGenerator).parser_;
  ppSVar5 = (pPVar3->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar5 !=
      (pPVar3->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_70.field_2;
    do {
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      struct_def = *ppSVar5;
      if ((pPVar3->opts).one_file == false) {
        this->cur_name_space_ = (struct_def->super_Definition).defined_namespace;
      }
      local_70._M_dataplus._M_p = (pointer)paVar1;
      GenStruct(this,struct_def,&local_70,&pPVar3->opts);
      if (((struct_def->super_Definition).generated == false) && (struct_def->fixed == false)) {
        GenTableVerifier(this,struct_def,&local_70);
      }
      pPVar3 = (this->super_BaseGenerator).parser_;
      if ((pPVar3->opts).one_file == true) {
        std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
      }
      else {
        bVar2 = SaveType(this,(string *)struct_def,(struct_def->super_Definition).defined_namespace,
                         &local_70,true,&pPVar3->opts);
        if (!bVar2) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar1) {
LAB_001a54ee:
            operator_delete(local_70._M_dataplus._M_p,
                            CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                     local_70.field_2._M_local_buf[0]) + 1);
          }
LAB_001a54fb:
          bVar2 = false;
          goto LAB_001a54fd;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      ppSVar5 = ppSVar5 + 1;
      pPVar3 = (this->super_BaseGenerator).parser_;
    } while (ppSVar5 !=
             (pPVar3->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pPVar3 = (this->super_BaseGenerator).parser_;
  bVar2 = true;
  if ((pPVar3->opts).one_file == true) {
    bVar2 = SaveType(this,(this->super_BaseGenerator).file_name_,pPVar3->current_namespace_,
                     &local_50,true,&pPVar3->opts);
  }
LAB_001a54fd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool generate() {
    std::string one_file_code;
    cur_name_space_ = parser_.current_namespace_;

    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      std::string enumcode;
      auto &enum_def = **it;
      if (!parser_.opts.one_file) cur_name_space_ = enum_def.defined_namespace;
      GenEnum(enum_def, &enumcode, parser_.opts);
      if (parser_.opts.one_file) {
        one_file_code += enumcode;
      } else {
        if (!SaveType(enum_def.name, *enum_def.defined_namespace, enumcode,
                      false, parser_.opts))
          return false;
      }
    }

    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      std::string declcode;
      auto &struct_def = **it;
      if (!parser_.opts.one_file)
        cur_name_space_ = struct_def.defined_namespace;
      GenStruct(struct_def, &declcode, parser_.opts);
      GenStructVerifier(struct_def, &declcode);
      if (parser_.opts.one_file) {
        one_file_code += declcode;
      } else {
        if (!SaveType(struct_def.name, *struct_def.defined_namespace, declcode,
                      true, parser_.opts))
          return false;
      }
    }

    if (parser_.opts.one_file) {
      return SaveType(file_name_, *parser_.current_namespace_, one_file_code,
                      true, parser_.opts);
    }
    return true;
  }